

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID __thiscall ImGuiWindow::GetIDFromRectangle(ImGuiWindow *this,ImRect *r_abs)

{
  float fVar1;
  float fVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  long lVar5;
  int r_rel [4];
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  pIVar3 = GImGui;
  lVar5 = (long)(this->IDStack).Size;
  if (0 < lVar5) {
    fVar1 = (this->Pos).x;
    local_18 = (int)((r_abs->Min).x - fVar1);
    fVar2 = (this->Pos).y;
    local_14 = (int)((r_abs->Min).y - fVar2);
    local_10 = (int)((r_abs->Max).x - fVar1);
    local_c = (int)((r_abs->Max).y - fVar2);
    uVar4 = ~(this->IDStack).Data[lVar5 + -1];
    lVar5 = 0;
    do {
      uVar4 = uVar4 >> 8 ^
              GCrc32LookupTable[(uint)*(byte *)((long)&local_18 + lVar5) ^ uVar4 & 0xff];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
    uVar4 = ~uVar4;
    if (GImGui->ActiveId == uVar4) {
      GImGui->ActiveIdIsAlive = uVar4;
    }
    if (pIVar3->ActiveIdPreviousFrame == uVar4) {
      pIVar3->ActiveIdPreviousFrameIsAlive = true;
    }
    return uVar4;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x695,"T &ImVector<unsigned int>::back() [T = unsigned int]");
}

Assistant:

ImGuiID ImGuiWindow::GetIDFromRectangle(const ImRect& r_abs)
{
    ImGuiID seed = IDStack.back();
    const int r_rel[4] = { (int)(r_abs.Min.x - Pos.x), (int)(r_abs.Min.y - Pos.y), (int)(r_abs.Max.x - Pos.x), (int)(r_abs.Max.y - Pos.y) };
    ImGuiID id = ImHashData(&r_rel, sizeof(r_rel), seed);
    ImGui::KeepAliveID(id);
    return id;
}